

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
::uninitialized_init
          (sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
           *this,index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                 *items,size_t count)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *__args;
  ulong in_RDX;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *in_RSI;
  vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
  *in_RDI;
  index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *item;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
  *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
  *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
  *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
  *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *this_00;
  index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff58;
  ulong local_60;
  
  if (in_RDX != 0) {
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
    ::reserve(in_RDI,in_stack_ffffffffffffff58);
    std::
    sort<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>*,bool(*)(jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&,jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&)>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (_func_bool_index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_ptr_index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_ptr
                *)in_stack_ffffffffffffff30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
    ::data((basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *)
           0xdc79f9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
    ::size(in_RSI);
    allocator_holder<std::pmr::polymorphic_allocator<char>_>::get_allocator
              ((allocator_holder<std::pmr::polymorphic_allocator<char>_> *)in_RDI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
    ::basic_string(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                   (size_type)in_stack_ffffffffffffff20,
                   (polymorphic_allocator<char> *)in_stack_ffffffffffffff18);
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
              ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_> *)
               in_stack_ffffffffffffff20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                     *)0xdc7a70);
    for (local_60 = 1; local_60 < in_RDX; local_60 = local_60 + 1) {
      bVar1 = std::operator!=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if (bVar1) {
        this_00 = (basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                   *)&(in_RDI->
                      super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data;
        in_stack_ffffffffffffff20 =
             (basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *)
             std::__cxx11::
             basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
             data((basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                   *)0xdc7afd);
        __args = (basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                  *)std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                    ::size((basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                            *)((long)in_RSI + local_60 * 0x40));
        allocator_holder<std::pmr::polymorphic_allocator<char>_>::get_allocator
                  ((allocator_holder<std::pmr::polymorphic_allocator<char>_> *)in_RDI);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
        basic_string(this_00,(char *)__args,(size_type)in_stack_ffffffffffffff20,
                     (polymorphic_allocator<char> *)in_stack_ffffffffffffff18);
        std::
        vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
        ::
        emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
                  ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                    *)this_00,__args,
                   (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                    *)in_stack_ffffffffffffff20);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                       *)0xdc7b68);
      }
    }
  }
  return;
}

Assistant:

void uninitialized_init(index_key_value<Json>* items, std::size_t count)
        {
            if (count > 0)
            {
                members_.reserve(count);

                std::sort(items, items+count, compare);
                members_.emplace_back(key_type(items[0].name.data(), items[0].name.size(), get_allocator()), std::move(items[0].value));
                
                for (std::size_t i = 1; i < count; ++i)
                {
                    auto& item = items[i];
                    if (item.name != items[i-1].name)
                    {
                        members_.emplace_back(key_type(item.name.data(), item.name.size(), get_allocator()), std::move(item.value));
                    }
                }
            }
        }